

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_logger-inl.h
# Opt level: O0

void __thiscall spdlog::async_logger::flush_(async_logger *this)

{
  bool bVar1;
  weak_ptr<spdlog::details::thread_pool> *in_RDI;
  shared_ptr<spdlog::details::thread_pool> pool_ptr;
  async_overflow_policy in_stack_00000144;
  async_logger_ptr *in_stack_00000148;
  thread_pool *in_stack_00000150;
  enable_shared_from_this<spdlog::async_logger> *in_stack_ffffffffffffff88;
  allocator *paVar2;
  allocator local_59;
  string local_58 [40];
  string *in_stack_ffffffffffffffd0;
  __shared_ptr local_18 [24];
  
  std::weak_ptr<spdlog::details::thread_pool>::lock(in_RDI);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_18);
  if (bVar1) {
    std::__shared_ptr_access<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x251241);
    std::enable_shared_from_this<spdlog::async_logger>::shared_from_this(in_stack_ffffffffffffff88);
    details::thread_pool::post_flush(in_stack_00000150,in_stack_00000148,in_stack_00000144);
    std::shared_ptr<spdlog::async_logger>::~shared_ptr((shared_ptr<spdlog::async_logger> *)0x251284)
    ;
  }
  else {
    paVar2 = &local_59;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"async flush: thread pool doesn\'t exist anymore",paVar2);
    throw_spdlog_ex(in_stack_ffffffffffffffd0);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
  }
  std::shared_ptr<spdlog::details::thread_pool>::~shared_ptr
            ((shared_ptr<spdlog::details::thread_pool> *)0x25133e);
  return;
}

Assistant:

SPDLOG_INLINE void spdlog::async_logger::flush_()
{
    if (auto pool_ptr = thread_pool_.lock())
    {
        pool_ptr->post_flush(shared_from_this(), overflow_policy_);
    }
    else
    {
        throw_spdlog_ex("async flush: thread pool doesn't exist anymore");
    }
}